

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeEnabledCase::test
          (VertexAttributeEnabledCase *this)

{
  CallLogWrapper *gl;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  GLenum in_R8D;
  ScopedLogSection section;
  GLuint vaos [2];
  ScopedLogSection local_70;
  string local_68;
  string local_48;
  
  pTVar3 = (this->super_ApiCase).m_log;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"DefaultVAO","");
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Test with default VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_70,pTVar3,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  gl = &(this->super_ApiCase).super_CallLogWrapper;
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,0,in_R8D);
  glu::CallLogWrapper::glEnableVertexAttribArray(gl,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,1,in_R8D);
  glu::CallLogWrapper::glDisableVertexAttribArray(gl,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,0,in_R8D);
  tcu::TestLog::endSection(local_70.m_log);
  pTVar3 = (this->super_ApiCase).m_log;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"WithVAO","");
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Test with VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_70,pTVar3,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  glu::CallLogWrapper::glGenVertexArrays(gl,2,(GLuint *)&local_68);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,(GLuint)local_68._M_dataplus._M_p);
  glu::CallLogWrapper::glEnableVertexAttribArray(gl,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,local_68._M_dataplus._M_p._4_4_);
  glu::CallLogWrapper::glDisableVertexAttribArray(gl,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,0,in_R8D);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,(GLuint)local_68._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,1,in_R8D);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(gl,2,(GLuint *)&local_68);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::TestLog::endSection(local_70.m_log);
  return;
}

Assistant:

void test (void)
	{
		// VERTEX_ATTRIB_ARRAY_ENABLED

		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_FALSE);
			glEnableVertexAttribArray(0);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_TRUE);
			glDisableVertexAttribArray(0);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_FALSE);
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint vaos[2] = {0};

			glGenVertexArrays(2, vaos);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glBindVertexArray(vaos[0]);
			glEnableVertexAttribArray(0);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glDisableVertexAttribArray(0);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_FALSE);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_TRUE);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			expectError(GL_NO_ERROR);
		}
	}